

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O3

int __thiscall
kj::anon_unknown_30::DatagramPortImpl::setsockopt
          (DatagramPortImpl *this,int __fd,int __level,int __optname,void *__optval,
          socklen_t __optlen)

{
  int iVar1;
  undefined4 in_register_0000000c;
  Fault f;
  Fault local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  do {
    iVar1 = ::setsockopt((this->super_OwnedFileDescriptor).fd,__fd,__level,
                         (void *)CONCAT44(in_register_0000000c,__optname),(socklen_t)__optval);
    if (-1 < iVar1) {
      return iVar1;
    }
    iVar1 = kj::_::Debug::getOsErrorNumber(false);
  } while (iVar1 == -1);
  if (iVar1 == 0) {
    return 0;
  }
  local_40.exception = (Exception *)0x0;
  local_38 = 0;
  uStack_30 = 0;
  kj::_::Debug::Fault::init
            (&local_40,
             (EVP_PKEY_CTX *)
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-unix.c++"
            );
  kj::_::Debug::Fault::fatal(&local_40);
}

Assistant:

void setsockopt(int level, int option, const void* value, uint length) override {
    KJ_SYSCALL(::setsockopt(fd, level, option, value, length));
  }